

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_object_history.cpp
# Opt level: O0

int __thiscall
ON_HistoryRecord::GetSubDEdgeChainValues
          (ON_HistoryRecord *this,int value_id,ON_SimpleArray<const_ON_SubDEdgeChain_*> *a)

{
  int iVar1;
  ON_Value *pOVar2;
  ON_SubDEdgeChain **x;
  int local_2c;
  int count;
  int i;
  ON_SubDEdgeChainHistoryValue *v;
  ON_SimpleArray<const_ON_SubDEdgeChain_*> *a_local;
  int value_id_local;
  ON_HistoryRecord *this_local;
  
  ON_SimpleArray<const_ON_SubDEdgeChain_*>::SetCount(a,0);
  pOVar2 = FindValueHelper(this,value_id,0xe,false);
  if (pOVar2 != (ON_Value *)0x0) {
    iVar1 = ON_SimpleArray<ON_SubDEdgeChain_*>::Count
                      ((ON_SimpleArray<ON_SubDEdgeChain_*> *)(pOVar2 + 1));
    ON_SimpleArray<const_ON_SubDEdgeChain_*>::Reserve(a,(long)iVar1);
    for (local_2c = 0; local_2c < iVar1; local_2c = local_2c + 1) {
      x = ON_SimpleArray<ON_SubDEdgeChain_*>::operator[]
                    ((ON_SimpleArray<ON_SubDEdgeChain_*> *)(pOVar2 + 1),local_2c);
      ON_SimpleArray<const_ON_SubDEdgeChain_*>::Append(a,x);
    }
  }
  iVar1 = ON_SimpleArray<const_ON_SubDEdgeChain_*>::Count(a);
  return iVar1;
}

Assistant:

int ON_HistoryRecord::GetSubDEdgeChainValues(int value_id, ON_SimpleArray<const ON_SubDEdgeChain*>& a) const
{
  a.SetCount(0);
  const ON_SubDEdgeChainHistoryValue* v = static_cast<ON_SubDEdgeChainHistoryValue*>(FindValueHelper(value_id, ON_Value::subd_edge_chain_value, 0));
  if (v)
  {
    int i, count = v->m_value.Count();
    a.Reserve(count);
    for (i = 0; i < count; i++)
      a.Append(v->m_value[i]);
  }
  return a.Count();
}